

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O1

void __thiscall OpenMD::FragmentStamp::checkNodes(FragmentStamp *this)

{
  pointer pcVar1;
  __normal_iterator<OpenMD::NodesStamp_**,_std::vector<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>_>
  _Var2;
  pointer ppNVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  OpenMDException *pOVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> nodeAtoms;
  ostringstream oss;
  string local_1e0;
  vector<int,_std::allocator<int>_> local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1e0._M_dataplus._M_p = (pointer)0x0;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::NodesStamp**,std::vector<OpenMD::NodesStamp*,std::allocator<OpenMD::NodesStamp*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::NodesStamp*const>>
                    ((this->nodesStamps_).
                     super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->nodesStamps_).
                     super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current !=
      (this->nodesStamps_).
      super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error in Molecule ",0x12);
    pcVar1 = (this->Name).data_._M_dataplus._M_p;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":nodes[",7);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] is missing\n",0xd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    OpenMDException::OpenMDException(pOVar5,&local_1e0);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  ppNVar3 = (this->nodesStamps_).
            super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->nodesStamps_).
      super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar3) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1c0,
                 (vector<int,_std::allocator<int>_> *)
                 (*(long *)((long)ppNVar3 + (lVar8 >> 0x1d)) + 0x70));
      local_1e0._M_string_length =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                        (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_1e0);
      if (_Var4._M_current !=
          local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar1 = (this->Name).data_._M_dataplus._M_p;
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar5,&local_1e0);
        __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar7 = uVar7 + 1;
      ppNVar3 = (this->nodesStamps_).
                super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x100000000;
    } while (uVar7 < (ulong)((long)(this->nodesStamps_).
                                   super__Vector_base<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3))
    ;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FragmentStamp::checkNodes() {
    std::ostringstream oss;
    std::vector<NodesStamp*>::iterator ni =
        std::find(nodesStamps_.begin(), nodesStamps_.end(),
                  static_cast<NodesStamp*>(NULL));
    if (ni != nodesStamps_.end()) {
      oss << "Error in Molecule " << getName() << ":nodes["
          << ni - nodesStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }

    for (std::size_t i = 0; i < getNNodes(); ++i) {
      NodesStamp* nStamp           = getNodesStamp(i);
      std::vector<int> nodeAtoms   = nStamp->getMembers();
      std::vector<int>::iterator j = std::find_if(
          nodeAtoms.begin(), nodeAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      if (j != nodeAtoms.end()) {
        oss << "Error in Fragment " << getName();
        throw OpenMDException(oss.str());
      }
    }
  }